

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentUtils.cpp
# Opt level: O2

DecPOMDPDiscreteInterface * ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(Arguments *args)

{
  TransitionObservationIndependentMADPDiscrete *this;
  ostream *poVar1;
  ProblemFireFightingFactored *this_00;
  char *pcVar2;
  FactoredDecPOMDPDiscreteInterface *pFVar3;
  Arguments *in_RDX;
  long lVar4;
  DecPOMDPDiscreteInterface *pDVar5;
  allocator<char> local_7a;
  allocator<char> local_79;
  MADPParser parser;
  string local_58;
  string dpomdpFile;
  
  switch(args->problem_type) {
  case DT:
    this_00 = (ProblemFireFightingFactored *)operator_new(0x250);
    ProblemDecTiger::ProblemDecTiger((ProblemDecTiger *)this_00);
    goto LAB_0040560f;
  case FF:
    this_00 = (ProblemFireFightingFactored *)operator_new(0x290);
    ProblemFireFighting::ProblemFireFighting
              ((ProblemFireFighting *)this_00,args->nrAgents,args->nrHouses,args->nrFLs,0.0,false);
LAB_0040560f:
    lVar4 = *(long *)(*(long *)&(this_00->super_FactoredDecPOMDPDiscrete).
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x50);
    goto LAB_00405689;
  case FFF:
    this_00 = (ProblemFireFightingFactored *)operator_new(0x790);
    ProblemFireFightingFactored::ProblemFireFightingFactored
              (this_00,args->nrAgents,args->nrHouses,args->nrFLs,0.0,false,args->extinguishProb,true
              );
    break;
  case FFG:
    this_00 = (ProblemFireFightingFactored *)operator_new(0x790);
    ProblemFireFightingGraph::ProblemFireFightingGraph
              ((ProblemFireFightingGraph *)this_00,args->nrAgents,args->nrFLs,args->extinguishProb,
               true);
    break;
  default:
    directories::MADPGetProblemFilename_abi_cxx11_(&dpomdpFile,(directories *)args,in_RDX);
    if (args->isTOI == 0) {
      pcVar2 = strstr(dpomdpFile._M_dataplus._M_p,".pgmx");
      if (pcVar2 == (char *)0x0) {
        pcVar2 = strstr(dpomdpFile._M_dataplus._M_p,".pomdp");
        if ((pcVar2 == (char *)0x0) &&
           (pcVar2 = strstr(dpomdpFile._M_dataplus._M_p,".POMDP"), pcVar2 == (char *)0x0)) {
          this = (TransitionObservationIndependentMADPDiscrete *)operator_new(0x230);
          std::__cxx11::string::string<std::allocator<char>>((string *)&parser,"",&local_79);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_7a);
          DecPOMDPDiscrete::DecPOMDPDiscrete
                    ((DecPOMDPDiscrete *)this,(string *)&parser,&local_58,&dpomdpFile);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)&parser);
          if (args->sparse != 0) {
            MultiAgentDecisionProcessDiscrete::SetSparse
                      ((MultiAgentDecisionProcessDiscrete *)this,true);
          }
          MADPParser::Parse(&parser,(DecPOMDPDiscrete *)this);
        }
        else {
          this = (TransitionObservationIndependentMADPDiscrete *)operator_new(0x230);
          std::__cxx11::string::string<std::allocator<char>>((string *)&parser,"",&local_79);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_7a);
          POMDPDiscrete::POMDPDiscrete
                    ((POMDPDiscrete *)this,(string *)&parser,&local_58,&dpomdpFile);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)&parser);
          if (args->sparse != 0) {
            MultiAgentDecisionProcessDiscrete::SetSparse
                      ((MultiAgentDecisionProcessDiscrete *)this,true);
          }
          MADPParser::Parse(&parser,(POMDPDiscrete *)this);
        }
        goto LAB_00405562;
      }
      pFVar3 = GetFactoredDecPOMDPDiscreteInterfaceFromArgs(args);
      if (pFVar3 == (FactoredDecPOMDPDiscreteInterface *)0x0) {
        pDVar5 = (DecPOMDPDiscreteInterface *)0x0;
      }
      else {
        pDVar5 = (DecPOMDPDiscreteInterface *)
                 (&pFVar3->field_0x0 + *(long *)(*(long *)pFVar3 + -0xf0));
      }
    }
    else {
      this = (TransitionObservationIndependentMADPDiscrete *)operator_new(0x2e8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&parser,"",&local_79);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_7a);
      TOIFactoredRewardDecPOMDPDiscrete::TOIFactoredRewardDecPOMDPDiscrete
                ((TOIFactoredRewardDecPOMDPDiscrete *)this,(string *)&parser,&local_58,&dpomdpFile,
                 args->cache_flat_models);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&parser);
      if (args->sparse != 0) {
        TransitionObservationIndependentMADPDiscrete::SetSparse(this,true);
      }
      MADPParser::Parse(&parser,(TOIFactoredRewardDecPOMDPDiscrete *)this);
LAB_00405562:
      pDVar5 = (DecPOMDPDiscreteInterface *)
               (&(this->super_MultiAgentDecisionProcess).field_0x0 +
               *(long *)(*(long *)&this->super_MultiAgentDecisionProcess + -0x50));
    }
    if (0 < args->verbose) {
      poVar1 = std::operator<<((ostream *)&std::cout,"ArgumentUtils: Problem file ");
      poVar1 = std::operator<<(poVar1,(string *)&dpomdpFile);
      poVar1 = std::operator<<(poVar1," parsed");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    std::__cxx11::string::~string((string *)&dpomdpFile);
    goto LAB_0040568c;
  case Aloha:
    this_00 = (ProblemFireFightingFactored *)operator_new(0x748);
    ProblemAloha::ProblemAloha
              ((ProblemAloha *)this_00,args->islandConf,args->alohaVariation,args->maxBacklog,
               args->nrAgents,true);
  }
  if (args->cache_flat_models == true) {
    (**(code **)(*(long *)&(this_00->super_FactoredDecPOMDPDiscrete).
                           super_MultiAgentDecisionProcessDiscreteFactoredStates.
                           super_MultiAgentDecisionProcess + 0x300))(this_00,args->sparse != 0);
  }
  lVar4 = *(long *)(*(long *)&(this_00->super_FactoredDecPOMDPDiscrete).
                              super_MultiAgentDecisionProcessDiscreteFactoredStates.
                              super_MultiAgentDecisionProcess + -0x60);
LAB_00405689:
  pDVar5 = (DecPOMDPDiscreteInterface *)
           (&(this_00->super_FactoredDecPOMDPDiscrete).
             super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
             field_0x0 + lVar4);
LAB_0040568c:
  if (0.0 < args->discount) {
    (**(code **)(*(long *)((long)&pDVar5->field_0x0 + *(long *)(*(long *)pDVar5 + -0xb0)) + 0x68))
              ((long)&pDVar5->field_0x0 + *(long *)(*(long *)pDVar5 + -0xb0));
  }
  if (0 < args->verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"ArgumentUtils: Problem ");
    (**(code **)(*(long *)((long)&pDVar5->field_0x0 + *(long *)(*(long *)pDVar5 + -0x40)) + 0x20))
              (&dpomdpFile,(long)&pDVar5->field_0x0 + *(long *)(*(long *)pDVar5 + -0x40));
    poVar1 = std::operator<<(poVar1,(string *)&dpomdpFile);
    poVar1 = std::operator<<(poVar1," instantiated.");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&dpomdpFile);
  }
  return pDVar5;
}

Assistant:

DecPOMDPDiscreteInterface* GetDecPOMDPDiscreteInterfaceFromArgs(const Arguments& args)
{
    DecPOMDPDiscreteInterface * dp = 0;
    switch(args.problem_type) 
    {

        case(ProblemType::DT):
        {
            ProblemDecTiger* p = new ProblemDecTiger();            
            dp = p;
            break;
        }
        case(ProblemType::FF):
        {
            dp = new ProblemFireFighting(args.nrAgents, args.nrHouses, 
                    args.nrFLs);
            break;
        }
        case(ProblemType::FFF):
        {
            ProblemFireFightingFactored* p = 
                new ProblemFireFightingFactored(args.nrAgents,
                                                args.nrHouses,
                                                args.nrFLs,
                                                0.0,
                                                false,
                                                args.extinguishProb);
            if(args.cache_flat_models)
                p->CacheFlatModels(args.sparse);
            dp = p;
            break;
        }
        case(ProblemType::FFG):
        {
            ProblemFireFightingGraph* p = 
                new ProblemFireFightingGraph(args.nrAgents,
                                             args.nrFLs,
                                             args.extinguishProb);
            if(args.cache_flat_models)
                p->CacheFlatModels(args.sparse);
            dp = p;
            break;
        }
        case(ProblemType::Aloha):
        {
            ProblemAloha* p =
                new ProblemAloha(   args.islandConf,
                                    args.alohaVariation,
                                    args.maxBacklog,
                                    args.nrAgents );

            if(args.cache_flat_models)
                p->CacheFlatModels(args.sparse);
            dp = p;
            break;
        }

        case(ProblemType::PARSE):
        default: //try to open the .dpomdp file and parse it
        {
            string dpomdpFile=directories::MADPGetProblemFilename(args);
            // load the DecPOMDP problem 
            if(args.isTOI)
            {
                TOIFactoredRewardDecPOMDPDiscrete *toi=
                    new TOIFactoredRewardDecPOMDPDiscrete("","",dpomdpFile,
                        args.cache_flat_models);
                if(args.sparse)
                    toi->SetSparse(true);
                MADPParser parser(toi);
#if 0 // this is done internally now
                if(args.cache_flat_models)
                {
                    if(args.sparse)
                        toi->CreateCentralizedSparseModels();
                    else
                        toi->CreateCentralizedFullModels();
                }                
#endif
                dp=toi;
            }
            else{
                if(strstr(dpomdpFile.c_str(),".pgmx"))
                    dp = GetFactoredDecPOMDPDiscreteInterfaceFromArgs(args);
                else if(
                        (strstr(dpomdpFile.c_str(),".pomdp"))
                    ||  (strstr(dpomdpFile.c_str(),".POMDP"))
                    )
                {
                    POMDPDiscrete* pomdp = 
                        new POMDPDiscrete("","",dpomdpFile);
                    if(args.sparse)
                        pomdp->SetSparse(true);
                    MADPParser parser(pomdp);
                    dp = pomdp;
                }
                else
                {
                    DecPOMDPDiscrete* decpomdp = 
                    new DecPOMDPDiscrete("","",dpomdpFile);
                    if(args.sparse)
                        decpomdp->SetSparse(true);
                    MADPParser parser(decpomdp);
                    dp = decpomdp;
                }
            }
            if(args.verbose > 0)
                cout << "ArgumentUtils: Problem file " << dpomdpFile << " parsed" << endl;
        }
    }
    if(args.discount > 0)
        dp->SetDiscount(args.discount);
            
    if(args.verbose > 0)
        cout << "ArgumentUtils: Problem " << dp->GetUnixName() 
             << " instantiated." << endl;

    return dp;
}